

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall fmt::v11::detail::bigint::square(bigint *this)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  uint *puVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  bool bVar14;
  basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_> n;
  basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_> local_d0;
  
  uVar2 = (uint)(this->bigits_).super_buffer<unsigned_int>.size_;
  uVar3 = uVar2 * 2;
  uVar4 = (ulong)uVar3;
  basic_memory_buffer<unsigned_int,_32UL,_fmt::v11::detail::allocator<unsigned_int>_>::
  basic_memory_buffer(&local_d0,&this->bigits_);
  if ((this->bigits_).super_buffer<unsigned_int>.capacity_ < uVar4) {
    (*(this->bigits_).super_buffer<unsigned_int>.grow_)((buffer<unsigned_int> *)this,uVar4);
  }
  uVar5 = (this->bigits_).super_buffer<unsigned_int>.capacity_;
  if (uVar4 < uVar5) {
    uVar5 = uVar4;
  }
  (this->bigits_).super_buffer<unsigned_int>.size_ = uVar5;
  if ((int)uVar2 < 1) {
    uVar4 = 0;
    uVar5 = 0;
  }
  else {
    puVar1 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
    uVar10 = 0;
    uVar4 = 0;
    uVar5 = 0;
    puVar9 = local_d0.super_buffer<unsigned_int>.ptr_;
    uVar8 = uVar10;
    do {
      do {
        bVar14 = CARRY8(uVar4,(ulong)local_d0.super_buffer<unsigned_int>.ptr_[uVar10] *
                              (ulong)*puVar9);
        uVar4 = uVar4 + (ulong)local_d0.super_buffer<unsigned_int>.ptr_[uVar10] * (ulong)*puVar9;
        uVar5 = uVar5 + bVar14;
        bVar14 = uVar10 != 0;
        uVar10 = uVar10 - 1;
        puVar9 = puVar9 + 1;
      } while (bVar14);
      puVar1[uVar8] = (uint)uVar4;
      uVar4 = uVar4 >> 0x20 | uVar5 << 0x20;
      uVar5 = uVar5 >> 0x20;
      uVar10 = uVar8 + 1;
      puVar9 = local_d0.super_buffer<unsigned_int>.ptr_;
      uVar8 = uVar10;
    } while (uVar10 != (uVar2 & 0x7fffffff));
  }
  if ((int)uVar2 < (int)uVar3) {
    puVar1 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
    lVar6 = (long)(int)uVar2;
    iVar13 = -uVar2;
    iVar11 = 1;
    lVar7 = lVar6;
    do {
      if (lVar7 < (int)(uVar2 - 1) + lVar6) {
        puVar9 = local_d0.super_buffer<unsigned_int>.ptr_ + iVar11;
        lVar12 = -1;
        do {
          bVar14 = CARRY8(uVar4,(ulong)local_d0.super_buffer<unsigned_int>.ptr_[lVar6 + lVar12] *
                                (ulong)*puVar9);
          uVar4 = uVar4 + (ulong)local_d0.super_buffer<unsigned_int>.ptr_[lVar6 + lVar12] *
                          (ulong)*puVar9;
          uVar5 = uVar5 + bVar14;
          lVar12 = lVar12 + -1;
          puVar9 = puVar9 + 1;
        } while (iVar13 != (int)lVar12);
      }
      puVar1[lVar7] = (uint)uVar4;
      uVar4 = uVar4 >> 0x20 | uVar5 << 0x20;
      uVar5 = uVar5 >> 0x20;
      lVar7 = lVar7 + 1;
      iVar11 = iVar11 + 1;
      iVar13 = iVar13 + 1;
    } while (lVar7 != (int)uVar3);
  }
  remove_leading_zeros(this);
  this->exp_ = this->exp_ << 1;
  if (local_d0.super_buffer<unsigned_int>.ptr_ != local_d0.store_) {
    free(local_d0.super_buffer<unsigned_int>.ptr_);
  }
  return;
}

Assistant:

FMT_CONSTEXPR20 void square() {
    int num_bigits = static_cast<int>(bigits_.size());
    int num_result_bigits = 2 * num_bigits;
    basic_memory_buffer<bigit, bigits_capacity> n(std::move(bigits_));
    bigits_.resize(to_unsigned(num_result_bigits));
    auto sum = uint128_t();
    for (int bigit_index = 0; bigit_index < num_bigits; ++bigit_index) {
      // Compute bigit at position bigit_index of the result by adding
      // cross-product terms n[i] * n[j] such that i + j == bigit_index.
      for (int i = 0, j = bigit_index; j >= 0; ++i, --j) {
        // Most terms are multiplied twice which can be optimized in the future.
        sum += double_bigit(n[i]) * n[j];
      }
      bigits_[bigit_index] = static_cast<bigit>(sum);
      sum >>= num_bits<bigit>();  // Compute the carry.
    }
    // Do the same for the top half.
    for (int bigit_index = num_bigits; bigit_index < num_result_bigits;
         ++bigit_index) {
      for (int j = num_bigits - 1, i = bigit_index - j; i < num_bigits;)
        sum += double_bigit(n[i++]) * n[j--];
      bigits_[bigit_index] = static_cast<bigit>(sum);
      sum >>= num_bits<bigit>();
    }
    remove_leading_zeros();
    exp_ *= 2;
  }